

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

AllocatedBlock * __thiscall ctemplate::BaseArena::IndexToBlock(BaseArena *this,int index)

{
  ulong uVar1;
  vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
  *pvVar2;
  pointer pAVar3;
  AllocatedBlock *pAVar4;
  AllocatedBlock *pAVar5;
  size_t sVar6;
  uint extraout_EDX;
  uint uVar7;
  undefined4 in_register_00000034;
  ulong block_size;
  ulong uVar8;
  
  block_size = CONCAT44(in_register_00000034,index);
  if ((uint)index < 0x10) {
    return this->first_blocks_ + (uint)index;
  }
  pvVar2 = this->overflow_blocks_;
  if (pvVar2 == (vector<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                 *)0x0) {
    IndexToBlock();
  }
  else {
    uVar7 = index - 0x10;
    block_size = (ulong)uVar7;
    if (-1 < (int)uVar7) {
      pAVar3 = (pvVar2->
               super__Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)uVar7 <
          (ulong)((long)(pvVar2->
                        super__Vector_base<ctemplate::BaseArena::AllocatedBlock,_std::allocator<ctemplate::BaseArena::AllocatedBlock>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pAVar3 >> 4)) {
        return pAVar3 + uVar7;
      }
      goto LAB_0012f4f0;
    }
  }
  IndexToBlock();
LAB_0012f4f0:
  IndexToBlock();
  if (block_size == 0) {
    return (AllocatedBlock *)0x0;
  }
  if (0 < (int)extraout_EDX) {
    uVar8 = (ulong)(int)extraout_EDX;
    uVar1 = uVar8 - 1;
    if ((uVar8 & uVar1) == 0) {
      if (this->block_size_ >> 2 < block_size) {
        if (extraout_EDX < 9) {
          pAVar4 = AllocNewBlock(this,block_size);
          return (AllocatedBlock *)pAVar4->mem;
        }
        __assert_fail("align <= kDefaultAlignment",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/arena.cc"
                      ,0x116,
                      "void *ctemplate::BaseArena::GetMemoryFallback(const size_t, const int)");
      }
      pAVar4 = (AllocatedBlock *)this->freestart_;
      if ((uVar1 & (ulong)pAVar4) == 0) {
        sVar6 = this->remaining_;
      }
      else {
        uVar8 = uVar8 - (uVar1 & (ulong)pAVar4);
        pAVar4 = (AllocatedBlock *)((long)pAVar4 + uVar8);
        this->freestart_ = (char *)pAVar4;
        sVar6 = 0;
        if (uVar8 <= this->remaining_) {
          sVar6 = this->remaining_ - uVar8;
        }
        this->remaining_ = sVar6;
      }
      if (sVar6 < block_size) {
        pAVar5 = AllocNewBlock(this,this->block_size_);
        pAVar4 = (AllocatedBlock *)pAVar5->mem;
        sVar6 = pAVar5->size;
      }
      this->remaining_ = sVar6 - block_size;
      this->last_alloc_ = (char *)pAVar4;
      this->freestart_ = (char *)((long)&pAVar4->mem + block_size);
      if ((uVar1 & (ulong)pAVar4) == 0) {
        return pAVar4;
      }
      __assert_fail("0 == (reinterpret_cast<uintptr_t>(last_alloc_) & (align-1))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/arena.cc"
                    ,0x12d,"void *ctemplate::BaseArena::GetMemoryFallback(const size_t, const int)")
      ;
    }
  }
  __assert_fail("align_as_int > 0 && 0 == (align & (align - 1))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/arena.cc"
                ,0x110,"void *ctemplate::BaseArena::GetMemoryFallback(const size_t, const int)");
}

Assistant:

const BaseArena::AllocatedBlock *BaseArena::IndexToBlock(int index) const {
  if (index < ARRAYSIZE(first_blocks_)) {
    return &first_blocks_[index];
  }
  CHECK(overflow_blocks_ != NULL);
  int index_in_overflow_blocks = index - ARRAYSIZE(first_blocks_);
  CHECK_GE(index_in_overflow_blocks, 0);
  CHECK_LT(static_cast<size_t>(index_in_overflow_blocks),
           overflow_blocks_->size());
  return &(*overflow_blocks_)[index_in_overflow_blocks];
}